

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Activation.cpp
# Opt level: O2

void CoreMLConverter::convertCaffeActivation(ConvertLayerParameters layerParameters)

{
  Rep *pRVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  Type *caffeLayer;
  NeuralNetworkLayer *this;
  ActivationParams *this_00;
  ActivationLeakyReLU *pAVar5;
  Type *pTVar6;
  ActivationPReLU *this_01;
  Type *pTVar7;
  WeightParams *pWVar8;
  ReLUParameter *pRVar9;
  void **ppvVar10;
  PReLUParameter *pPVar11;
  long lVar12;
  long lVar13;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  
  caffeLayer = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                         (&((layerParameters.prototxt)->layer_).super_RepeatedPtrFieldBase,
                          *layerParameters.layerId);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (layerParameters.nnWrite);
  if (((caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_ == 1) &&
     ((caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_ == 1)) {
    lVar13 = 1;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_b8,"Must have 1 input and 1 output",(allocator *)&local_98);
    errorInCaffeProto(&local_b8,(caffeLayer->name_).ptr_,(caffeLayer->type_).ptr_);
    std::__cxx11::string::~string((string *)&local_b8);
    lVar13 = (long)(caffeLayer->bottom_).super_RepeatedPtrFieldBase.current_size_;
  }
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bottom.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  top.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar1 = (caffeLayer->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  for (lVar12 = 0; lVar13 * 8 != lVar12; lVar12 = lVar12 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&bottom,*(value_type **)((long)ppvVar10 + lVar12));
  }
  pRVar1 = (caffeLayer->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  iVar4 = (caffeLayer->top_).super_RepeatedPtrFieldBase.current_size_;
  for (lVar13 = 0; (long)iVar4 * 8 != lVar13; lVar13 = lVar13 + 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&top,*(value_type **)((long)ppvVar10 + lVar13));
  }
  convertCaffeMetadata
            ((caffeLayer->name_).ptr_,&bottom,&top,layerParameters.nnWrite,
             layerParameters.mappingDataBlobNames);
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(this);
  bVar3 = std::operator==((caffeLayer->type_).ptr_,"ReLU");
  if (bVar3) {
    pRVar9 = caffeLayer->relu_param_;
    if (pRVar9 == (ReLUParameter *)0x0) {
      pRVar9 = (ReLUParameter *)&caffe::_ReLUParameter_default_instance_;
    }
    if (ABS(pRVar9->negative_slope_) < 1e-06) {
      CoreML::Specification::ActivationParams::mutable_relu(this_00);
      goto LAB_00482504;
    }
    pAVar5 = CoreML::Specification::ActivationParams::mutable_leakyrelu(this_00);
  }
  else {
    bVar3 = std::operator==((caffeLayer->type_).ptr_,"TanH");
    if (bVar3) {
      CoreML::Specification::ActivationParams::mutable_tanh(this_00);
      goto LAB_00482504;
    }
    bVar3 = std::operator==((caffeLayer->type_).ptr_,"Sigmoid");
    if (bVar3) {
      CoreML::Specification::ActivationParams::mutable_sigmoid(this_00);
      goto LAB_00482504;
    }
    bVar3 = std::operator==((caffeLayer->type_).ptr_,"ELU");
    if (!bVar3) {
      bVar3 = std::operator==((caffeLayer->type_).ptr_,"BNLL");
      if (bVar3) {
        CoreML::Specification::ActivationParams::mutable_softplus(this_00);
      }
      else {
        bVar3 = std::operator==((caffeLayer->type_).ptr_,"PReLU");
        if (bVar3) {
          iVar4 = getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                             (&((layerParameters.protoweights)->layer_).super_RepeatedPtrFieldBase,
                              iVar4);
          pPVar11 = caffeLayer->prelu_param_;
          if (pPVar11 == (PReLUParameter *)0x0) {
            pPVar11 = (PReLUParameter *)&caffe::_PReLUParameter_default_instance_;
          }
          this_01 = CoreML::Specification::ActivationParams::mutable_prelu(this_00);
          if ((pTVar6->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
            std::__cxx11::string::string
                      ((string *)&local_b8,"Parameters (alpha values) not found",&local_b9);
            psVar2 = (caffeLayer->name_).ptr_;
            std::__cxx11::string::string((string *)&local_98,"PReLU",&local_ba);
            errorInCaffeProto(&local_b8,psVar2,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&local_b8);
          }
          if (pPVar11->channel_shared_ == true) {
            pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                               (&(pTVar6->blobs_).super_RepeatedPtrFieldBase,0);
            if ((pTVar7->data_).current_size_ != 1) {
              std::__cxx11::string::string
                        ((string *)&local_b8,
                         "Expected a scalar parameter (alpha) when \'channel_shared\' flag is set",
                         &local_b9);
              psVar2 = (caffeLayer->name_).ptr_;
              std::__cxx11::string::string((string *)&local_98,"PReLU",&local_ba);
              errorInCaffeProto(&local_b8,psVar2,&local_98);
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
            }
          }
          pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&(pTVar6->blobs_).super_RepeatedPtrFieldBase,0);
          iVar4 = (pTVar7->data_).current_size_;
          pWVar8 = CoreML::Specification::ActivationPReLU::mutable_alpha(this_01);
          local_b8._M_dataplus._M_p._0_4_ = 0;
          google::protobuf::RepeatedField<float>::Resize
                    (&pWVar8->floatvalue_,iVar4,(float *)&local_b8);
          pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                             (&(pTVar6->blobs_).super_RepeatedPtrFieldBase,0);
          google::protobuf::RepeatedField<float>::CopyFrom(&pWVar8->floatvalue_,&pTVar7->data_);
        }
      }
      goto LAB_00482504;
    }
    pRVar9 = (ReLUParameter *)caffeLayer->elu_param_;
    pAVar5 = (ActivationLeakyReLU *)CoreML::Specification::ActivationParams::mutable_elu(this_00);
    if (pRVar9 == (ReLUParameter *)0x0) {
      pRVar9 = (ReLUParameter *)&caffe::_ELUParameter_default_instance_;
    }
  }
  pAVar5->alpha_ = pRVar9->negative_slope_;
LAB_00482504:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&top);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bottom);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeActivation(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    
    Specification::ActivationParams* specLayerParams = specLayer->mutable_activation();
    
    if (caffeLayer.type() == "ReLU"){
        const caffe::ReLUParameter& caffeLayerParams = caffeLayer.relu_param();
        if (std::abs(caffeLayerParams.negative_slope()) < 1e-6f) {
            (void) specLayerParams->mutable_relu();
        } else {
            auto* leakyRelu = specLayerParams->mutable_leakyrelu();
            leakyRelu->set_alpha(caffeLayerParams.negative_slope());
        }
    } else if (caffeLayer.type() == "TanH"){
        (void) specLayerParams->mutable_tanh();
    } else if (caffeLayer.type() == "Sigmoid"){
        (void) specLayerParams->mutable_sigmoid();
    } else if (caffeLayer.type() == "ELU") {
        const caffe::ELUParameter& caffeLayerParams = caffeLayer.elu_param();
        specLayerParams->mutable_elu()->set_alpha(caffeLayerParams.alpha());
    } else if (caffeLayer.type() == "BNLL") {
        (void) specLayerParams->mutable_softplus();
    } else if (caffeLayer.type() == "PReLU") {
        int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
        const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
        const caffe::PReLUParameter& caffeLayerParams = caffeLayer.prelu_param();
        auto* prelu = specLayerParams->mutable_prelu();
        //***************** Some Error Checking in Caffe Proto **********
        if (caffeLayerWeights.blobs_size() == 0){
            CoreMLConverter::errorInCaffeProto("Parameters (alpha values) not found", caffeLayer.name(), "PReLU");
        }
        if (caffeLayerParams.channel_shared()) {
            if (caffeLayerWeights.blobs(0).data_size() != 1){
                CoreMLConverter::errorInCaffeProto("Expected a scalar parameter (alpha) when 'channel_shared' flag is set", caffeLayer.name(), "PReLU");
            }
        }
        //***************************************************************
        int C = caffeLayerWeights.blobs(0).data_size();
        ::google::protobuf::RepeatedField<float>* alpha = prelu->mutable_alpha()->mutable_floatvalue();
        alpha->Resize(C, 0.0);
        alpha->CopyFrom(caffeLayerWeights.blobs(0).data());
    }
    
}